

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.c
# Opt level: O3

wchar_t history_def_first(void *p,HistEventW *ev)

{
  undefined8 *puVar1;
  wchar_t *pwVar2;
  
  puVar1 = *(undefined8 **)((long)p + 0x18);
  *(undefined8 **)((long)p + 0x28) = puVar1;
  if (puVar1 != (undefined8 *)p) {
    pwVar2 = (wchar_t *)puVar1[1];
    *(undefined8 *)ev = *puVar1;
    ev->str = pwVar2;
    return L'\0';
  }
  ev->num = L'\x03';
  ev->str = anon_var_dwarf_5343;
  return L'\xffffffff';
}

Assistant:

static int
history_def_first(void *p, TYPE(HistEvent) *ev)
{
	history_t *h = (history_t *) p;

	h->cursor = h->list.next;
	if (h->cursor != &h->list)
		*ev = h->cursor->ev;
	else {
		he_seterrev(ev, _HE_FIRST_NOTFOUND);
		return -1;
	}

	return 0;
}